

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata_Linear::Alloc
          (VmaBlockMetadata_Linear *this,VmaAllocationRequest *request,VmaSuballocationType type,
          void *userData)

{
  long lVar1;
  long in_RSI;
  VmaBlockMetadata_Linear *in_RDI;
  SuballocationVectorType *suballocations2nd_1;
  SuballocationVectorType *suballocations1st_1;
  SuballocationVectorType *suballocations1st;
  SuballocationVectorType *suballocations2nd;
  VmaSuballocation newSuballoc;
  VkDeviceSize offset;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  
  lVar1 = *(long *)(in_RSI + 8);
  iVar2 = *(int *)(in_RSI + 0x30);
  if (iVar2 == 2) {
    AccessSuballocations2nd(in_RDI);
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::push_back
              ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff90),(VmaSuballocation *)in_RDI);
    in_RDI->m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
  }
  else if (iVar2 == 3) {
    AccessSuballocations1st(in_RDI);
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::push_back
              ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff90),(VmaSuballocation *)in_RDI);
  }
  else if (iVar2 == 4) {
    AccessSuballocations1st(in_RDI);
    AccessSuballocations2nd(in_RDI);
    if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_EMPTY) {
      in_RDI->m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
    }
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::push_back
              ((VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff90),(VmaSuballocation *)in_RDI);
  }
  in_RDI->m_SumFreeSize = in_RDI->m_SumFreeSize - lVar1;
  return;
}

Assistant:

void VmaBlockMetadata_Linear::Alloc(
    const VmaAllocationRequest& request,
    VmaSuballocationType type,
    void* userData)
{
    const VkDeviceSize offset = (VkDeviceSize)request.allocHandle - 1;
    const VmaSuballocation newSuballoc = { offset, request.size, userData, type };

    switch (request.type)
    {
    case VmaAllocationRequestType::UpperAddress:
    {
        VMA_ASSERT(m_2ndVectorMode != SECOND_VECTOR_RING_BUFFER &&
            "CRITICAL ERROR: Trying to use linear allocator as double stack while it was already used as ring buffer.");
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
        suballocations2nd.push_back(newSuballoc);
        m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
    }
    break;
    case VmaAllocationRequestType::EndOf1st:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();

        VMA_ASSERT(suballocations1st.empty() ||
            offset >= suballocations1st.back().offset + suballocations1st.back().size);
        // Check if it fits before the end of the block.
        VMA_ASSERT(offset + request.size <= GetSize());

        suballocations1st.push_back(newSuballoc);
    }
    break;
    case VmaAllocationRequestType::EndOf2nd:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();
        // New allocation at the end of 2-part ring buffer, so before first allocation from 1st vector.
        VMA_ASSERT(!suballocations1st.empty() &&
            offset + request.size <= suballocations1st[m_1stNullItemsBeginCount].offset);
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

        switch (m_2ndVectorMode)
        {
        case SECOND_VECTOR_EMPTY:
            // First allocation from second part ring buffer.
            VMA_ASSERT(suballocations2nd.empty());
            m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
            break;
        case SECOND_VECTOR_RING_BUFFER:
            // 2-part ring buffer is already started.
            VMA_ASSERT(!suballocations2nd.empty());
            break;
        case SECOND_VECTOR_DOUBLE_STACK:
            VMA_ASSERT(0 && "CRITICAL ERROR: Trying to use linear allocator as ring buffer while it was already used as double stack.");
            break;
        default:
            VMA_ASSERT(0);
        }

        suballocations2nd.push_back(newSuballoc);
    }
    break;
    default:
        VMA_ASSERT(0 && "CRITICAL INTERNAL ERROR.");
    }

    m_SumFreeSize -= newSuballoc.size;
}